

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Expression * __thiscall
soul::heart::Parser::parseArraySlice
          (Parser *this,FunctionParseState *state,Expression *lhs,int64_t start,int64_t end)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *this_00;
  Module *this_01;
  Expression *pEVar3;
  unsigned_long local_c8;
  unsigned_long local_c0;
  ArrayElement *local_b8;
  ArrayElement *s;
  CompileMessage local_68;
  unsigned_long local_30;
  int64_t end_local;
  int64_t start_local;
  Expression *lhs_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  local_30 = end;
  end_local = start;
  start_local = (int64_t)lhs;
  lhs_local = (Expression *)state;
  state_local = (FunctionParseState *)this;
  iVar2 = (*(lhs->super_Object)._vptr_Object[2])();
  bVar1 = Type::isArrayOrVector((Type *)CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    Errors::targetIsNotAnArray<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_68);
    CompileMessage::~CompileMessage(&local_68);
  }
  this_00 = (Type *)(**(code **)(*(long *)start_local + 0x10))();
  bVar1 = Type::isValidArrayOrVectorRange<long>(this_00,end_local,local_30);
  if (!bVar1) {
    Errors::illegalSliceSize<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&s);
    CompileMessage::~CompileMessage((CompileMessage *)&s);
  }
  this_01 = pool_ptr<soul::Module>::operator->(&this->module);
  local_c0 = end_local;
  local_c8 = local_30;
  local_b8 = Module::
             allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,unsigned_long,unsigned_long>
                       (this_01,&(this->
                                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                 ).location,(Expression *)start_local,&local_c0,&local_c8);
  pEVar3 = parseSuffixOperators(this,(FunctionParseState *)lhs_local,&local_b8->super_Expression);
  return pEVar3;
}

Assistant:

heart::Expression& parseArraySlice (const FunctionParseState& state, heart::Expression& lhs, int64_t start, int64_t end)
    {
        if (! lhs.getType().isArrayOrVector())
            throwError (Errors::targetIsNotAnArray());

        if (! lhs.getType().isValidArrayOrVectorRange (start, end))
            throwError (Errors::illegalSliceSize());

        auto& s = module->allocate<heart::ArrayElement> (location, lhs, (size_t) start, (size_t) end);
        return parseSuffixOperators (state, s);
    }